

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int __thiscall argo::reader::next(reader *this)

{
  ulong uVar1;
  json_io_exception *this_00;
  int local_2c;
  int c;
  int res;
  reader *this_local;
  
  if (this->m_put_back == 1000) {
    if ((this->m_block_read & 1U) == 0) {
      local_2c = (*this->_vptr_reader[4])();
    }
    else {
      local_2c = read_next_char_from_block(this);
    }
    uVar1 = this->m_byte_index + 1;
    this->m_byte_index = uVar1;
    if (this->m_max_message_length < uVar1) {
      this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
      json_io_exception::json_io_exception(this_00,message_too_long_e,this->m_max_message_length);
      __cxa_throw(this_00,&json_io_exception::typeinfo,json_io_exception::~json_io_exception);
    }
    this_local._4_4_ = local_2c;
  }
  else {
    this_local._4_4_ = this->m_put_back;
    this->m_put_back = 1000;
  }
  return this_local._4_4_;
}

Assistant:

int reader::next()
{
    if (m_put_back == no_put_back)
    {
        int res = m_block_read ?  read_next_char_from_block() : read_next_char();

        if (++m_byte_index > m_max_message_length)
        {
            throw json_io_exception(json_exception::message_too_long_e, m_max_message_length);
        }

        return res;
    }
    else
    {
        int c = m_put_back;
        m_put_back = no_put_back;
        return c;
    }
}